

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnsynchedPipe.h
# Opt level: O2

void __thiscall
teetime::
UnsynchedPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~UnsynchedPipe(UnsynchedPipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this)

{
  (this->
  super_Pipe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  super_AbstractPipe._vptr_AbstractPipe = (_func_int **)&PTR__UnsynchedPipe_0014b570;
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::reset
            (&this->m_value);
  return;
}

Assistant:

explicit UnsynchedPipe(AbstractStage* targetStage)
     : m_targetStage(targetStage)
    {
    }